

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_algebraic.h
# Opt level: O0

void mp::WriteJSON<mp::QuadAndLinTerms,mp::AlgConRange>
               (JSONW *jw,AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *algc)

{
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange> *in_RSI;
  char *in_stack_ffffffffffffff88;
  char *__str;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  AlgConRange *in_stack_ffffffffffffffa8;
  JSONW *in_stack_ffffffffffffffb0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *in_stack_ffffffffffffffb8;
  string_view in_stack_ffffffffffffffc0;
  QuadAndLinTerms *in_stack_ffffffffffffffd8;
  JSONW *in_stack_ffffffffffffffe0;
  
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  __str = &stack0xffffffffffffffe0;
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::GetBody(in_RSI);
  WriteJSON<mp::MiniJSONWriter<fmt::BasicMemoryWriter<char,std::allocator<char>>>,mp::QuadAndLinTerms>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2a460b);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (in_stack_ffffffffffffff90,__str);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::operator[]
            (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffc0);
  AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>::GetRhsOrRange(in_RSI);
  WriteJSON(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_>::~MiniJSONWriter
            ((MiniJSONWriter<fmt::BasicMemoryWriter<char,_std::allocator<char>_>_> *)0x2a4669);
  return;
}

Assistant:

inline void WriteJSON(JSONW jw,
                      const AlgebraicConstraint<Body, RhsOrRange>& algc) {
  WriteJSON(jw["body"], algc.GetBody());
  WriteJSON(jw["rhs_or_range"], algc.GetRhsOrRange());
}